

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O2

string * findModelObjectiveName_abi_cxx11_
                   (string *__return_storage_ptr__,HighsLp *lp,HighsHessian *hessian)

{
  double dVar1;
  bool bVar2;
  __type _Var3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  string trimmed_name;
  
  bVar2 = std::operator!=(&lp->objective_name_,"");
  if (bVar2) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&lp->objective_name_);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&trimmed_name);
    uVar6 = 0;
    uVar5 = (ulong)(uint)lp->num_col_;
    if (lp->num_col_ < 1) {
      uVar5 = uVar6;
    }
    while (uVar5 != uVar6) {
      dVar1 = (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar6];
      uVar6 = uVar6 + 1;
      if ((dVar1 != 0.0) || (NAN(dVar1))) break;
    }
    iVar4 = 0;
    while (std::__cxx11::string::assign((char *)__return_storage_ptr__),
          (lp->row_names_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (lp->row_names_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
      if (iVar4 != 0) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      lVar8 = -1;
      lVar7 = 0;
      do {
        lVar8 = lVar8 + 1;
        if (lp->num_row_ <= lVar8) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::string
                  ((string *)&trimmed_name,
                   (string *)
                   ((long)&(((lp->row_names_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar7))
        ;
        trim(&trimmed_name,&default_non_chars_abi_cxx11_);
        std::__cxx11::string::_M_assign((string *)&trimmed_name);
        lVar7 = lVar7 + 0x20;
        _Var3 = std::operator==(__return_storage_ptr__,&trimmed_name);
        std::__cxx11::string::~string((string *)&trimmed_name);
      } while (!_Var3);
      iVar4 = iVar4 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string findModelObjectiveName(const HighsLp* lp,
                                   const HighsHessian* hessian) {
  // Return any non-trivial current objective name
  if (lp->objective_name_ != "") return lp->objective_name_;

  std::string objective_name = "";
  // Determine whether there is a nonzero cost vector
  bool has_objective = false;
  for (HighsInt iCol = 0; iCol < lp->num_col_; iCol++) {
    if (lp->col_cost_[iCol]) {
      has_objective = true;
      break;
    }
  }
  if (!has_objective && hessian) {
    // Zero cost vector, so only chance of an objective comes from any
    // Hessian
    has_objective = (hessian->dim_ != 0);
  }
  HighsInt pass = 0;
  for (;;) {
    // Loop until a valid name is found. Vanishingly unlikely to have
    // to pass more than once, since check for objective name
    // duplicating a row name is very unlikely to fail
    //
    // So set up an appropriate name (stem)
    if (has_objective) {
      objective_name = "Obj";
    } else {
      objective_name = "NoObj";
    }
    // If there are no row names, then the objective name is certainly
    // OK
    if (lp->row_names_.size() == 0) break;
    if (pass != 0) objective_name += pass;
    // Ensure that the objective name doesn't clash with any row names
    bool ok_objective_name = true;
    for (HighsInt iRow = 0; iRow < lp->num_row_; iRow++) {
      std::string trimmed_name = lp->row_names_[iRow];
      trimmed_name = trim(trimmed_name);
      if (objective_name == trimmed_name) {
        ok_objective_name = false;
        break;
      }
    }
    if (ok_objective_name) break;
    pass++;
  }
  assert(objective_name != "");
  return objective_name;
}